

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1decode.c
# Opt level: O3

FT_Error t1_decoder_parse_metrics
                   (T1_Decoder_conflict decoder,FT_Byte *charstring_base,FT_UInt charstring_len)

{
  FT_Vector *pFVar1;
  FT_Pos *pFVar2;
  FT_Long *pFVar3;
  byte bVar4;
  long *plVar5;
  FT_Byte **ppFVar6;
  bool bVar7;
  FT_Long FVar8;
  size_t *psVar9;
  long lVar10;
  T1_Decoder_Zone pTVar11;
  uint uVar12;
  uint uVar13;
  FT_Long *pFVar14;
  FT_Long *pFVar15;
  bool bVar16;
  byte *pbVar17;
  ulong uVar18;
  T1_Decoder_ZoneRec *pTVar19;
  byte *pbVar20;
  byte *pbVar21;
  long local_48;
  
  pFVar3 = decoder->stack;
  decoder->top = pFVar3;
  pTVar19 = decoder->zones;
  decoder->zone = pTVar19;
  (decoder->builder).parse_state = T1_Parse_Start;
  decoder->zones[0].base = charstring_base;
  pbVar17 = charstring_base + charstring_len;
  decoder->zones[0].limit = pbVar17;
  decoder->zones[0].cursor = charstring_base;
  if (charstring_len == 0) {
    return 0xa0;
  }
  local_48 = 0x8e0;
  bVar7 = false;
  do {
    plVar5 = decoder->top;
    pbVar20 = charstring_base + 1;
    bVar4 = *charstring_base;
    uVar12 = (uint)bVar4;
    bVar16 = bVar7;
    switch(bVar4) {
    case 1:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 0xe:
    case 0xf:
    case 0x15:
    case 0x16:
    case 0x1e:
    case 0x1f:
      goto LAB_0022d904;
    case 2:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
switchD_0022d63d_caseD_2:
      if (bVar4 < 0x20) {
        return 0xa0;
      }
      if (bVar4 < 0xf7) {
        uVar12 = uVar12 - 0x8b;
        pbVar21 = pbVar20;
      }
      else {
        pbVar21 = charstring_base + 2;
        if (pbVar17 < pbVar21) {
          return 0xa0;
        }
        if (bVar4 < 0xfb) {
          uVar12 = (uVar12 * 0x100 + (uint)*pbVar20) - 0xf694;
        }
        else {
          uVar12 = 0xfa94 - (uVar12 * 0x100 | (uint)*pbVar20);
        }
      }
      uVar13 = uVar12 << 0x10;
      if (bVar7) {
        uVar13 = uVar12;
      }
      goto LAB_0022d8c9;
    case 10:
      lVar10 = 0x16;
      break;
    case 0xb:
      lVar10 = 0x18;
      break;
    case 0xc:
      if (pbVar17 <= pbVar20) {
        return 0xa0;
      }
      pbVar20 = charstring_base + 2;
      lVar10 = 4;
      if (charstring_base[1] == 7) break;
      lVar10 = 0x14;
      pbVar21 = pbVar20;
      if (charstring_base[1] != 0xc) {
        return 0xa0;
      }
      goto LAB_0022d716;
    case 0xd:
      lVar10 = 2;
      break;
    default:
      if (uVar12 != 0xff) goto switchD_0022d63d_caseD_2;
      pbVar21 = charstring_base + 5;
      if (pbVar21 <= pbVar17) {
        uVar12 = *(uint *)(charstring_base + 1);
        uVar13 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8;
        uVar12 = uVar13 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
        if (uVar12 - 0x7d01 < 0xffff05ff) {
          uVar13 = uVar12;
          bVar16 = true;
          if (bVar7) {
            return 0xa0;
          }
        }
        else {
          uVar13 = uVar13 << 0x10;
          if (bVar7) {
            uVar13 = uVar12;
          }
        }
LAB_0022d8c9:
        if ((long)plVar5 - (long)pFVar3 < 0x7f9) {
          *plVar5 = (long)(int)uVar13;
          pFVar15 = plVar5 + 1;
          bVar7 = bVar16;
          goto LAB_0022d8e4;
        }
      }
      goto LAB_0022d904;
    }
    pbVar21 = pbVar20;
    if (bVar7) {
      return 0xa0;
    }
LAB_0022d716:
    if ((long)plVar5 - (long)pFVar3 >> 3 < (long)t1_args_count[lVar10]) {
      return 0xa1;
    }
    uVar12 = (int)lVar10 - 2U >> 1;
    if (0xb < uVar12) {
      return 0xa0;
    }
    pFVar14 = plVar5 + -(long)t1_args_count[lVar10];
    switch(uVar12) {
    case 0:
      (decoder->builder).parse_state = T1_Parse_Have_Width;
      pFVar1 = &(decoder->builder).left_bearing;
      pFVar1->x = pFVar1->x + *pFVar14;
      (decoder->builder).advance.x = pFVar14[1];
      FVar8 = 0;
      goto LAB_0022d95e;
    case 1:
      (decoder->builder).parse_state = T1_Parse_Have_Width;
      pFVar1 = &(decoder->builder).left_bearing;
      pFVar1->x = pFVar1->x + *pFVar14;
      pFVar2 = &(decoder->builder).left_bearing.y;
      *pFVar2 = *pFVar2 + pFVar14[1];
      (decoder->builder).advance.x = pFVar14[2];
      FVar8 = pFVar14[3];
LAB_0022d95e:
      (decoder->builder).advance.y = FVar8;
      return 0;
    default:
      goto LAB_0022d904;
    case 9:
      pFVar15 = pFVar14 + 1;
      FVar8 = FT_DivFix(*pFVar14,pFVar14[1]);
      *pFVar14 = FVar8;
      bVar7 = false;
      goto LAB_0022d8e4;
    case 10:
      uVar12 = (uint)*(short *)((long)pFVar14 + 2);
      if (decoder->subrs_hash != (FT_Hash)0x0) {
        psVar9 = ft_hash_num_lookup(uVar12,decoder->subrs_hash);
        if (psVar9 == (size_t *)0x0) {
          return 0xa0;
        }
        uVar12 = (uint)*psVar9;
      }
      if ((int)uVar12 < 0) {
        return 0xa0;
      }
      if (decoder->num_subrs <= (int)uVar12) {
        return 0xa0;
      }
      if (0xa48 < local_48) {
        return 0xa0;
      }
      pTVar19->cursor = pbVar21;
      pTVar11 = (T1_Decoder_Zone)((long)&(decoder->builder).loader + local_48);
      ppFVar6 = decoder->subrs;
      pbVar21 = ppFVar6[uVar12];
      *(byte **)((long)&(decoder->builder).base + local_48) = pbVar21;
      if (decoder->subrs_len == (FT_UInt *)0x0) {
        uVar18 = (ulong)(uint)decoder->lenIV;
        if (decoder->lenIV < 1) {
          uVar18 = 0;
        }
        pbVar21 = pbVar21 + uVar18;
        *(byte **)((long)&(decoder->builder).base + local_48) = pbVar21;
        pbVar17 = ppFVar6[(ulong)uVar12 + 1];
      }
      else {
        pbVar17 = pbVar21 + decoder->subrs_len[uVar12];
      }
      *(byte **)((long)&(decoder->builder).current + local_48) = pbVar17;
      pTVar11->cursor = pbVar21;
      if (pbVar21 == (byte *)0x0) {
        return 0xa0;
      }
      local_48 = local_48 + 0x18;
      break;
    case 0xb:
      if (local_48 < 0x8e1) {
        return 0xa0;
      }
      pTVar11 = (T1_Decoder_Zone)((long)decoder + local_48 + -0x18);
      pbVar21 = pTVar11->cursor;
      pbVar17 = *(byte **)((long)decoder + local_48 + -8);
      local_48 = local_48 + -0x18;
    }
    decoder->zone = pTVar11;
    pFVar15 = pFVar14;
LAB_0022d8e4:
    decoder->top = pFVar15;
    pTVar19 = (T1_Decoder_ZoneRec *)((long)&(decoder->builder).memory + local_48);
    charstring_base = pbVar21;
  } while (pbVar21 < pbVar17);
LAB_0022d904:
  return 0xa0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  t1_decoder_parse_metrics( T1_Decoder  decoder,
                            FT_Byte*    charstring_base,
                            FT_UInt     charstring_len )
  {
    T1_Decoder_Zone  zone;
    FT_Byte*         ip;
    FT_Byte*         limit;
    T1_Builder       builder = &decoder->builder;
    FT_Bool          large_int;

#ifdef FT_DEBUG_LEVEL_TRACE
    FT_Bool          bol = TRUE;
#endif


    /* First of all, initialize the decoder */
    decoder->top  = decoder->stack;
    decoder->zone = decoder->zones;
    zone          = decoder->zones;

    builder->parse_state = T1_Parse_Start;

    zone->base           = charstring_base;
    limit = zone->limit  = charstring_base + charstring_len;
    ip    = zone->cursor = zone->base;

    large_int = FALSE;

    /* now, execute loop */
    while ( ip < limit )
    {
      FT_Long*     top   = decoder->top;
      T1_Operator  op    = op_none;
      FT_Int32     value = 0;


#ifdef FT_DEBUG_LEVEL_TRACE
      if ( bol )
      {
        FT_TRACE5(( " (%ld)", decoder->top - decoder->stack ));
        bol = FALSE;
      }
#endif

      /**********************************************************************
       *
       * Decode operator or operand
       *
       */

      /* first of all, decompress operator or value */
      switch ( *ip++ )
      {
      case 1:
      case 3:
      case 4:
      case 5:
      case 6:
      case 7:
      case 8:
      case 9:
      case 14:
      case 15:
      case 21:
      case 22:
      case 30:
      case 31:
        goto No_Width;

      case 10:
        op = op_callsubr;
        break;
      case 11:
        op = op_return;
        break;

      case 13:
        op = op_hsbw;
        break;

      case 12:
        if ( ip >= limit )
        {
          FT_ERROR(( "t1_decoder_parse_metrics:"
                     " invalid escape (12+EOF)\n" ));
          goto Syntax_Error;
        }

        switch ( *ip++ )
        {
        case 7:
          op = op_sbw;
          break;
        case 12:
          op = op_div;
          break;

        default:
          goto No_Width;
        }
        break;

      case 255:    /* four bytes integer */
        if ( ip + 4 > limit )
        {
          FT_ERROR(( "t1_decoder_parse_metrics:"
                     " unexpected EOF in integer\n" ));
          goto Syntax_Error;
        }

        value = (FT_Int32)( ( (FT_UInt32)ip[0] << 24 ) |
                            ( (FT_UInt32)ip[1] << 16 ) |
                            ( (FT_UInt32)ip[2] << 8  ) |
                              (FT_UInt32)ip[3]         );
        ip += 4;

        /* According to the specification, values > 32000 or < -32000 must */
        /* be followed by a `div' operator to make the result be in the    */
        /* range [-32000;32000].  We expect that the second argument of    */
        /* `div' is not a large number.  Additionally, we don't handle     */
        /* stuff like `<large1> <large2> <num> div <num> div' or           */
        /* <large1> <large2> <num> div div'.  This is probably not allowed */
        /* anyway.                                                         */
        if ( value > 32000 || value < -32000 )
        {
          if ( large_int )
          {
            FT_ERROR(( "t1_decoder_parse_metrics:"
                       " no `div' after large integer\n" ));
            goto Syntax_Error;
          }
          else
            large_int = TRUE;
        }
        else
        {
          if ( !large_int )
            value = (FT_Int32)( (FT_UInt32)value << 16 );
        }

        break;

      default:
        if ( ip[-1] >= 32 )
        {
          if ( ip[-1] < 247 )
            value = (FT_Int32)ip[-1] - 139;
          else
          {
            if ( ++ip > limit )
            {
              FT_ERROR(( "t1_decoder_parse_metrics:"
                         " unexpected EOF in integer\n" ));
              goto Syntax_Error;
            }

            if ( ip[-2] < 251 )
              value =    ( ( ip[-2] - 247 ) * 256 ) + ip[-1] + 108;
            else
              value = -( ( ( ip[-2] - 251 ) * 256 ) + ip[-1] + 108 );
          }

          if ( !large_int )
            value = (FT_Int32)( (FT_UInt32)value << 16 );
        }
        else
        {
          FT_ERROR(( "t1_decoder_parse_metrics:"
                     " invalid byte (%d)\n", ip[-1] ));
          goto Syntax_Error;
        }
      }

      if ( large_int && !( op == op_none || op == op_div ) )
      {
        FT_ERROR(( "t1_decoder_parse_metrics:"
                   " no `div' after large integer\n" ));
        goto Syntax_Error;
      }

      /**********************************************************************
       *
       * Push value on stack, or process operator
       *
       */
      if ( op == op_none )
      {
        if ( top - decoder->stack >= T1_MAX_CHARSTRINGS_OPERANDS )
        {
          FT_ERROR(( "t1_decoder_parse_metrics: stack overflow\n" ));
          goto Syntax_Error;
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( large_int )
          FT_TRACE4(( " %d", value ));
        else
          FT_TRACE4(( " %d", value / 65536 ));
#endif

        *top++       = value;
        decoder->top = top;
      }
      else  /* general operator */
      {
        FT_Int  num_args = t1_args_count[op];


        FT_ASSERT( num_args >= 0 );

        if ( top - decoder->stack < num_args )
          goto Stack_Underflow;

#ifdef FT_DEBUG_LEVEL_TRACE

        switch ( op )
        {
        case op_callsubr:
        case op_div:
        case op_return:
          break;

        default:
          if ( top - decoder->stack != num_args )
            FT_TRACE0(( "t1_decoder_parse_metrics:"
                        " too much operands on the stack"
                        " (seen %ld, expected %d)\n",
                        top - decoder->stack, num_args ));
          break;
        }

#endif /* FT_DEBUG_LEVEL_TRACE */

        top -= num_args;

        switch ( op )
        {
        case op_hsbw:
          FT_TRACE4(( " hsbw" ));

          builder->parse_state = T1_Parse_Have_Width;

          builder->left_bearing.x = ADD_LONG( builder->left_bearing.x,
                                              top[0] );

          builder->advance.x = top[1];
          builder->advance.y = 0;

          /* we only want to compute the glyph's metrics */
          /* (lsb + advance width) without loading the   */
          /* rest of it; so exit immediately             */
          FT_TRACE4(( "\n" ));
          return FT_Err_Ok;

        case op_sbw:
          FT_TRACE4(( " sbw" ));

          builder->parse_state = T1_Parse_Have_Width;

          builder->left_bearing.x = ADD_LONG( builder->left_bearing.x,
                                              top[0] );
          builder->left_bearing.y = ADD_LONG( builder->left_bearing.y,
                                              top[1] );

          builder->advance.x = top[2];
          builder->advance.y = top[3];

          /* we only want to compute the glyph's metrics */
          /* (lsb + advance width), without loading the  */
          /* rest of it; so exit immediately             */
          FT_TRACE4(( "\n" ));
          return FT_Err_Ok;

        case op_div:
          FT_TRACE4(( " div" ));

          /* if `large_int' is set, we divide unscaled numbers; */
          /* otherwise, we divide numbers in 16.16 format --    */
          /* in both cases, it is the same operation            */
          *top = FT_DivFix( top[0], top[1] );
          top++;

          large_int = FALSE;
          break;

        case op_callsubr:
          {
            FT_Int  idx;


            FT_TRACE4(( " callsubr" ));

            idx = Fix2Int( top[0] );

            if ( decoder->subrs_hash )
            {
              size_t*  val = ft_hash_num_lookup( idx,
                                                 decoder->subrs_hash );


              if ( val )
                idx = *val;
              else
                idx = -1;
            }

            if ( idx < 0 || idx >= decoder->num_subrs )
            {
              FT_ERROR(( "t1_decoder_parse_metrics:"
                         " invalid subrs index\n" ));
              goto Syntax_Error;
            }

            if ( zone - decoder->zones >= T1_MAX_SUBRS_CALLS )
            {
              FT_ERROR(( "t1_decoder_parse_metrics:"
                         " too many nested subrs\n" ));
              goto Syntax_Error;
            }

            zone->cursor = ip;  /* save current instruction pointer */

            zone++;

            /* The Type 1 driver stores subroutines without the seed bytes. */
            /* The CID driver stores subroutines with seed bytes.  This     */
            /* case is taken care of when decoder->subrs_len == 0.          */
            zone->base = decoder->subrs[idx];

            if ( decoder->subrs_len )
              zone->limit = zone->base + decoder->subrs_len[idx];
            else
            {
              /* We are using subroutines from a CID font.  We must adjust */
              /* for the seed bytes.                                       */
              zone->base  += ( decoder->lenIV >= 0 ? decoder->lenIV : 0 );
              zone->limit  = decoder->subrs[idx + 1];
            }

            zone->cursor = zone->base;

            if ( !zone->base )
            {
              FT_ERROR(( "t1_decoder_parse_metrics:"
                         " invoking empty subrs\n" ));
              goto Syntax_Error;
            }

            decoder->zone = zone;
            ip            = zone->base;
            limit         = zone->limit;
            break;
          }

        case op_return:
          FT_TRACE4(( " return" ));

          if ( zone <= decoder->zones )
          {
            FT_ERROR(( "t1_decoder_parse_metrics:"
                       " unexpected return\n" ));
            goto Syntax_Error;
          }

          zone--;
          ip            = zone->cursor;
          limit         = zone->limit;
          decoder->zone = zone;
          break;

        default:
          FT_ERROR(( "t1_decoder_parse_metrics:"
                     " unhandled opcode %d\n", op ));
          goto Syntax_Error;
        }

        decoder->top = top;

      } /* general operator processing */

    } /* while ip < limit */

    FT_TRACE4(( "..end..\n" ));
    FT_TRACE4(( "\n" ));

  No_Width:
    FT_ERROR(( "t1_decoder_parse_metrics:"
               " no width, found op %d instead\n",
               ip[-1] ));
  Syntax_Error:
    return FT_THROW( Syntax_Error );

  Stack_Underflow:
    return FT_THROW( Stack_Underflow );
  }